

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmFileAPICodemodel.cxx
# Opt level: O0

Value * __thiscall
anon_unknown.dwarf_1144a71::Target::DumpPrecompileHeader
          (Value *__return_storage_ptr__,Target *this,
          JBT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          *header)

{
  Value *this_00;
  Value local_50;
  undefined1 local_21;
  JBT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> *local_20;
  JBT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *header_local;
  Target *this_local;
  Value *precompileHeader;
  
  local_21 = 0;
  local_20 = header;
  header_local = (JBT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)this;
  this_local = (Target *)__return_storage_ptr__;
  Json::Value::Value(__return_storage_ptr__,objectValue);
  Json::Value::Value(&local_50,&local_20->Value);
  this_00 = Json::Value::operator[](__return_storage_ptr__,"header");
  Json::Value::operator=(this_00,&local_50);
  Json::Value::~Value(&local_50);
  AddBacktrace(this,__return_storage_ptr__,(JBTIndex)(local_20->Backtrace).Index);
  return __return_storage_ptr__;
}

Assistant:

Json::Value Target::DumpPrecompileHeader(JBT<std::string> const& header)
{
  Json::Value precompileHeader = Json::objectValue;
  precompileHeader["header"] = header.Value;
  this->AddBacktrace(precompileHeader, header.Backtrace);
  return precompileHeader;
}